

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

bool __thiscall Tokenizer::tryToSkipComments(Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  
  cVar1 = Stream::peek(&this->stream_);
  if (cVar1 == '/') {
    iVar3 = Stream::advance(&this->stream_);
    bVar4 = iVar3 == 0x2f;
    bVar2 = bVar4;
    while (bVar2) {
      while ((cVar1 = Stream::peek(&this->stream_), cVar1 != '\n' &&
             (bVar2 = Stream::eof(&this->stream_), !bVar2))) {
        Stream::advance(&this->stream_);
      }
      Stream::advance(&this->stream_);
      cVar1 = Stream::peek(&this->stream_);
      if (cVar1 != '/') {
        return true;
      }
      iVar3 = Stream::advance(&this->stream_);
      bVar2 = iVar3 == 0x2f;
    }
    Stream::unget(&this->stream_);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Tokenizer::tryToSkipComments()
{
  bool result = false;
  while(stream_.peek() == '/')
  {
    if(stream_.advance() == '/')
    {
      result = true;
      while(stream_.peek() != '\n' && !stream_.eof())
        stream_.advance();
      stream_.advance();
    }
    else
    {
      stream_.unget();
      break;
    }
  }

  return result;
}